

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_ManGetClpStats_rec(Cba_Ntk_t *p,int *pCountN,int *pCountI,int *pCountO)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  Cba_Ntk_t *p_00;
  long lVar9;
  long lVar10;
  
  iVar2 = p->Id;
  if (pCountN[iVar2] < 0) {
    pCountO[iVar2] = 0;
    pCountI[iVar2] = 0;
    pCountN[iVar2] = 0;
    uVar3 = (p->vObjType).nSize;
    uVar7 = (ulong)uVar3;
    if (1 < (int)uVar3) {
      lVar9 = 1;
      do {
        lVar5 = (long)(int)uVar7;
        if (lVar5 <= lVar9) {
LAB_003acd64:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        cVar1 = (p->vObjType).pArray[lVar9];
        if (cVar1 != '\0') {
          if ((byte)(cVar1 + 0xa6U) < 0xaa) {
            if (cVar1 != '\x03') goto LAB_003acd25;
            if ((p->vObjFunc).nSize < 1) {
              bVar4 = true;
              lVar10 = 0;
            }
            else {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar9 + 1,0);
              iVar8 = (p->vObjFunc).nSize;
              if (iVar8 <= lVar9) goto LAB_003acd45;
              lVar10 = (long)(p->vObjFunc).pArray[lVar9];
              lVar5 = (long)(p->vObjType).nSize;
              bVar4 = iVar8 < 1;
            }
            if (lVar5 <= lVar9) goto LAB_003acd64;
            if ((bool)((p->vObjType).pArray[lVar9] != '\x03' | bVar4)) {
LAB_003accb5:
              p_00 = (Cba_Ntk_t *)0x0;
            }
            else {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar9 + 1,0);
              if ((p->vObjFunc).nSize <= lVar9) goto LAB_003acd45;
              iVar8 = (p->vObjFunc).pArray[lVar9];
              if (((long)iVar8 < 1) || ((p->pDesign->vNtks).nSize <= iVar8)) goto LAB_003accb5;
              p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[iVar8];
            }
            Cba_ManGetClpStats_rec(p_00,pCountN,pCountI,pCountO);
            lVar5 = lVar9 + 1;
            if ((p->vObjFon0).nSize <= lVar5) {
LAB_003acd45:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar6 = (p->vObjFon0).pArray;
            pCountN[iVar2] =
                 pCountN[iVar2] + ((piVar6[lVar9 + 1] + pCountN[lVar10]) - piVar6[lVar9]);
            if ((p->vObjFon0).nSize <= lVar5) goto LAB_003acd45;
            pCountI[iVar2] =
                 pCountI[iVar2] + ((piVar6[lVar9 + 1] + pCountI[lVar10]) - piVar6[lVar9]);
            if ((p->vObjFon0).nSize <= lVar5) goto LAB_003acd45;
            iVar8 = piVar6[lVar9 + 1] + pCountO[lVar10];
          }
          else {
            pCountN[iVar2] = pCountN[iVar2] + 1;
            if (((long)(p->vObjFin0).nSize <= lVar9 + 1) ||
               (piVar6 = (p->vObjFin0).pArray,
               pCountI[iVar2] = pCountI[iVar2] + (piVar6[lVar9 + 1] - piVar6[lVar9]),
               (long)(p->vObjFon0).nSize <= lVar9 + 1)) goto LAB_003acd45;
            piVar6 = (p->vObjFon0).pArray;
            iVar8 = piVar6[lVar9 + 1];
          }
          pCountO[iVar2] = (iVar8 - piVar6[lVar9]) + pCountO[iVar2];
        }
LAB_003acd25:
        lVar9 = lVar9 + 1;
        uVar7 = (ulong)(p->vObjType).nSize;
      } while (lVar9 < (long)uVar7);
    }
  }
  return;
}

Assistant:

void Cba_ManGetClpStats_rec( Cba_Ntk_t * p, int * pCountN, int * pCountI, int * pCountO )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountN[Id] >= 0 )
        return;
    pCountN[Id] = pCountI[Id] = pCountO[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim(p, iObj) )
        {
            pCountN[Id] += 1;
            pCountI[Id] += Cba_ObjFinNum(p, iObj);
            pCountO[Id] += Cba_ObjFonNum(p, iObj);
        }
        else if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            int NtkId = Cba_ObjNtkId(p, iObj);
            Cba_ManGetClpStats_rec( Cba_ObjNtk(p, iObj), pCountN, pCountI, pCountO );
            pCountN[Id] += pCountN[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountI[Id] += pCountI[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountO[Id] += pCountO[NtkId] + Cba_ObjFonNum(p, iObj);
        }
}